

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_read_cb(void *arg)

{
  nng_err nVar1;
  uint uVar2;
  nni_aio *aio_00;
  void *pvVar3;
  undefined1 local_58 [8];
  nni_iov iov_1;
  ws_frame *fr2;
  size_t totlen;
  nni_iov iov;
  ws_frame *frame;
  nni_aio *aio;
  nni_ws *ws;
  void *arg_local;
  
  aio_00 = (nni_aio *)((long)arg + 0x2c0);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  iov.iov_len = *(size_t *)((long)arg + 0xf0);
  if (iov.iov_len == 0) {
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  }
  else {
    nVar1 = nni_aio_result(aio_00);
    if (nVar1 == NNG_OK) {
      if (*(long *)(iov.iov_len + 0xa0) == 0) {
        *(undefined8 *)(iov.iov_len + 0xa0) = 2;
        *(uint *)(iov.iov_len + 0xb0) = *(byte *)(iov.iov_len + 0x10) & 0x7f;
        *(bool *)(iov.iov_len + 0xb4) = (*(byte *)(iov.iov_len + 0x10) & 0x80) != 0;
        *(bool *)(iov.iov_len + 0xb5) = (*(byte *)(iov.iov_len + 0x11) & 0x80) != 0;
        if ((*(byte *)(iov.iov_len + 0xb5) & 1) != 0) {
          *(long *)(iov.iov_len + 0xa0) = *(long *)(iov.iov_len + 0xa0) + 4;
        }
        if ((*(byte *)(iov.iov_len + 0x11) & 0x7f) == 0x7f) {
          *(long *)(iov.iov_len + 0xa0) = *(long *)(iov.iov_len + 0xa0) + 8;
        }
        else if ((*(byte *)(iov.iov_len + 0x11) & 0x7f) == 0x7e) {
          *(long *)(iov.iov_len + 0xa0) = *(long *)(iov.iov_len + 0xa0) + 2;
        }
        if (*(long *)(iov.iov_len + 0xa0) != 2) {
          totlen = iov.iov_len + 0x12;
          iov.iov_buf = (void *)(*(long *)(iov.iov_len + 0xa0) + -2);
          nni_aio_set_iov(aio_00,1,(nni_iov *)&totlen);
          nni_http_read_full(*(nni_http_conn **)((long)arg + 0x9e8),aio_00);
          nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
          return;
        }
      }
      if (*(long *)(iov.iov_len + 200) == 0) {
        uVar2 = *(byte *)(iov.iov_len + 0x11) & 0x7f;
        *(ulong *)(iov.iov_len + 0xa8) = (ulong)uVar2;
        if (uVar2 == 0x7e) {
          *(long *)(iov.iov_len + 0xa8) =
               (long)(int)((uint)*(byte *)(iov.iov_len + 0x12) * 0x100 +
                          (uint)*(byte *)(iov.iov_len + 0x13));
          if (*(ulong *)(iov.iov_len + 0xa8) < 0x7e) {
            ws_close((nni_ws *)arg,0x3ea);
            nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
            return;
          }
        }
        else if (((ulong)uVar2 == 0x7f) &&
                (*(ulong *)(iov.iov_len + 0xa8) =
                      ((ulong)*(byte *)(iov.iov_len + 0x12) << 0x38) +
                      ((ulong)*(byte *)(iov.iov_len + 0x13) << 0x30) +
                      ((ulong)*(byte *)(iov.iov_len + 0x14) << 0x28) +
                      ((ulong)*(byte *)(iov.iov_len + 0x15) << 0x20) +
                      (ulong)*(byte *)(iov.iov_len + 0x16) * 0x1000000 +
                      (ulong)*(byte *)(iov.iov_len + 0x17) * 0x10000 +
                      (ulong)*(byte *)(iov.iov_len + 0x18) * 0x100 +
                      (ulong)*(byte *)(iov.iov_len + 0x19), *(ulong *)(iov.iov_len + 0xa8) < 0x10000
                )) {
          ws_close((nni_ws *)arg,0x3ea);
          nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
          return;
        }
        if ((*(ulong *)((long)arg + 0x9f0) < *(ulong *)(iov.iov_len + 0xa8)) &&
           (*(long *)((long)arg + 0x9f0) != 0)) {
          ws_close((nni_ws *)arg,0x3f1);
          nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
          return;
        }
        if (((*(byte *)((long)arg + 0x55) & 1) == 0) && (*(long *)((long)arg + 0xa00) != 0)) {
          fr2 = *(ws_frame **)(iov.iov_len + 0xa8);
          for (iov_1.iov_len = (size_t)nni_list_first((nni_list *)((long)arg + 0xd0));
              iov_1.iov_len != 0;
              iov_1.iov_len =
                   (size_t)nni_list_next((nni_list *)((long)arg + 0xd0),(void *)iov_1.iov_len)) {
            fr2 = (ws_frame *)(fr2->head + *(long *)(iov_1.iov_len + 0xa8) + -0x10);
          }
          if (*(ws_frame **)((long)arg + 0xa00) < fr2) {
            ws_close((nni_ws *)arg,0x3f1);
            nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
            return;
          }
        }
        if ((*(byte *)(iov.iov_len + 0xb5) & 1) == 0) {
          if ((*(byte *)((long)arg + 0x50) & 1) != 0) {
            ws_close((nni_ws *)arg,0x3ea);
            nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
            return;
          }
        }
        else {
          *(undefined4 *)(iov.iov_len + 0x1e) =
               *(undefined4 *)(iov.iov_len + 0xc + *(long *)(iov.iov_len + 0xa0));
          if ((*(byte *)((long)arg + 0x50) & 1) == 0) {
            ws_close((nni_ws *)arg,0x3ea);
            nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
            return;
          }
        }
        if (*(long *)(iov.iov_len + 0xa8) != 0) {
          if (*(ulong *)(iov.iov_len + 0xa8) < 0x7e) {
            *(size_t *)(iov.iov_len + 200) = iov.iov_len + 0x22;
            *(undefined8 *)(iov.iov_len + 0xb8) = 0;
          }
          else {
            pvVar3 = nni_alloc(*(size_t *)(iov.iov_len + 0xa8));
            *(void **)(iov.iov_len + 0xc0) = pvVar3;
            if (*(long *)(iov.iov_len + 0xc0) == 0) {
              ws_close((nni_ws *)arg,0x3f3);
              nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
              return;
            }
            *(undefined8 *)(iov.iov_len + 0xb8) = *(undefined8 *)(iov.iov_len + 0xa8);
            *(undefined8 *)(iov.iov_len + 200) = *(undefined8 *)(iov.iov_len + 0xc0);
          }
          local_58 = *(undefined1 (*) [8])(iov.iov_len + 200);
          iov_1.iov_buf = *(void **)(iov.iov_len + 0xa8);
          nni_aio_set_iov(aio_00,1,(nni_iov *)local_58);
          nni_http_read_full(*(nni_http_conn **)((long)arg + 0x9e8),aio_00);
          nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
          return;
        }
      }
      ws_unmask_frame((ws_frame *)iov.iov_len);
      ws_read_frame_cb((nni_ws *)arg,(ws_frame *)iov.iov_len);
      ws_start_read((nni_ws *)arg);
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
    }
    else {
      *(undefined1 *)((long)arg + 0x51) = 1;
      ws_close((nni_ws *)arg,0);
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
    }
  }
  return;
}

Assistant:

static void
ws_read_cb(void *arg)
{
	nni_ws   *ws  = arg;
	nni_aio  *aio = &ws->rxaio;
	ws_frame *frame;

	nni_mtx_lock(&ws->mtx);
	if ((frame = ws->rxframe) == NULL) {
		nni_mtx_unlock(&ws->mtx); // canceled during close
		return;
	}

	if (nni_aio_result(aio) != 0) {
		// on a read error, we assume the connection was
		// abruptly closed, and we don't try to shut down nicely
		ws->closed = true;
		ws_close(ws, 0);
		nni_mtx_unlock(&ws->mtx);
		return;
	}

	if (frame->hlen == 0) {
		frame->hlen   = 2;
		frame->op     = frame->head[0] & 0x7fu;
		frame->final  = (frame->head[0] & 0x80u) ? 1 : 0;
		frame->masked = (frame->head[1] & 0x80u) ? 1 : 0;
		if (frame->masked) {
			frame->hlen += 4;
		}
		if ((frame->head[1] & 0x7Fu) == 127) {
			frame->hlen += 8;
		} else if ((frame->head[1] & 0x7Fu) == 126) {
			frame->hlen += 2;
		}

		// If we didn't read the full header yet, then read
		// the rest of it.
		if (frame->hlen != 2) {
			nni_iov iov;
			iov.iov_buf = frame->head + 2;
			iov.iov_len = frame->hlen - 2;
			nni_aio_set_iov(aio, 1, &iov);
			nni_http_read_full(ws->http, aio);
			nni_mtx_unlock(&ws->mtx);
			return;
		}
	}

	// If we are returning from a read of additional data, then
	// the buf will be set.  Otherwise, we need to determine
	// how much data to read.  As our headers are complete, we take
	// this time to do some protocol checks -- no point in waiting
	// to read data.  (Frame size check needs to be done first
	// anyway to prevent DoS.)

	if (frame->buf == NULL) {

		// Determine expected frame size.
		switch ((frame->len = (frame->head[1] & 0x7Fu))) {
		case 127:
			NNI_GET64(frame->head + 2, frame->len);
			if (frame->len < 65536) {
				ws_close(ws, WS_CLOSE_PROTOCOL_ERR);
				nni_mtx_unlock(&ws->mtx);
				return;
			}
			break;
		case 126:
			NNI_GET16(frame->head + 2, frame->len);
			if (frame->len < 126) {
				ws_close(ws, WS_CLOSE_PROTOCOL_ERR);
				nni_mtx_unlock(&ws->mtx);
				return;
			}

			break;
		}

		if ((frame->len > ws->maxframe) && (ws->maxframe > 0)) {
			ws_close(ws, WS_CLOSE_TOO_BIG);
			nni_mtx_unlock(&ws->mtx);
			return;
		}
		// For message mode, also check to make sure that the overall
		// length of the message has not exceeded our recvmax.
		// (Protect against an infinite stream of small messages!)
		if ((!ws->isstream) && (ws->recvmax > 0)) {
			size_t    totlen = frame->len;
			ws_frame *fr2;
			NNI_LIST_FOREACH (&ws->rxq, fr2) {
				totlen += fr2->len;
			}
			if (totlen > ws->recvmax) {
				ws_close(ws, WS_CLOSE_TOO_BIG);
				nni_mtx_unlock(&ws->mtx);
				return;
			}
		}

		// Check for masking.  (We don't actually unmask
		// here, because we don't have data yet.)
		if (frame->masked) {
			memcpy(frame->mask, frame->head + frame->hlen - 4, 4);
			if (!ws->server) {
				ws_close(ws, WS_CLOSE_PROTOCOL_ERR);
				nni_mtx_unlock(&ws->mtx);
				return;
			}
		} else if (ws->server) {
			ws_close(ws, WS_CLOSE_PROTOCOL_ERR);
			nni_mtx_unlock(&ws->mtx);
			return;
		}

		// If we expected data, then ask for it.
		if (frame->len != 0) {

			nni_iov iov;

			// Short frames can avoid an alloc
			if (frame->len < 126) {
				frame->buf   = frame->sdata;
				frame->asize = 0;
			} else {
				frame->adata = nni_alloc(frame->len);
				if (frame->adata == NULL) {
					ws_close(ws, WS_CLOSE_INTERNAL);
					nni_mtx_unlock(&ws->mtx);
					return;
				}
				frame->asize = frame->len;
				frame->buf   = frame->adata;
			}

			iov.iov_buf = frame->buf;
			iov.iov_len = frame->len;
			nni_aio_set_iov(aio, 1, &iov);
			nni_http_read_full(ws->http, aio);
			nni_mtx_unlock(&ws->mtx);
			return;
		}
	}

	// At this point, we have a complete frame.
	ws_unmask_frame(frame); // idempotent

	ws_read_frame_cb(ws, frame);
	ws_start_read(ws);
	nni_mtx_unlock(&ws->mtx);
}